

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O0

void Sfm_NtkFree(Sfm_Ntk_t *p)

{
  Sfm_Ntk_t *p_local;
  
  Vec_StrFree(p->vFixed);
  Vec_StrFreeP(&p->vEmpty);
  Vec_WrdFree(p->vTruths);
  Vec_WecErase(&p->vFanins);
  Vec_IntFree(p->vStarts);
  Vec_WrdFree(p->vTruths2);
  Vec_WecErase(&p->vFanouts);
  if ((p->vLevels).pArray != (int *)0x0) {
    free((p->vLevels).pArray);
    (p->vLevels).pArray = (int *)0x0;
  }
  if ((p->vLevelsR).pArray != (int *)0x0) {
    free((p->vLevelsR).pArray);
    (p->vLevelsR).pArray = (int *)0x0;
  }
  if ((p->vCounts).pArray != (int *)0x0) {
    free((p->vCounts).pArray);
    (p->vCounts).pArray = (int *)0x0;
  }
  if ((p->vTravIds).pArray != (int *)0x0) {
    free((p->vTravIds).pArray);
    (p->vTravIds).pArray = (int *)0x0;
  }
  if ((p->vTravIds2).pArray != (int *)0x0) {
    free((p->vTravIds2).pArray);
    (p->vTravIds2).pArray = (int *)0x0;
  }
  if ((p->vId2Var).pArray != (int *)0x0) {
    free((p->vId2Var).pArray);
    (p->vId2Var).pArray = (int *)0x0;
  }
  if ((p->vVar2Id).pArray != (int *)0x0) {
    free((p->vVar2Id).pArray);
    (p->vVar2Id).pArray = (int *)0x0;
  }
  Vec_WecFree(p->vCnfs);
  Vec_IntFree(p->vCover);
  Vec_IntFreeP(&p->vNodes);
  Vec_IntFreeP(&p->vDivs);
  Vec_IntFreeP(&p->vRoots);
  Vec_IntFreeP(&p->vTfo);
  Vec_WrdFreeP(&p->vDivCexes);
  Vec_IntFreeP(&p->vOrder);
  Vec_IntFreeP(&p->vDivVars);
  Vec_IntFreeP(&p->vDivIds);
  Vec_IntFreeP(&p->vLits);
  Vec_IntFreeP(&p->vValues);
  Vec_WecFreeP(&p->vClauses);
  Vec_IntFreeP(&p->vFaninMap);
  if (p->pSat != (sat_solver *)0x0) {
    sat_solver_delete(p->pSat);
  }
  if (p != (Sfm_Ntk_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Sfm_NtkFree( Sfm_Ntk_t * p )
{
    // user data
    Vec_StrFree( p->vFixed );
    Vec_StrFreeP( &p->vEmpty );
    Vec_WrdFree( p->vTruths );
    Vec_WecErase( &p->vFanins );
    Vec_IntFree( p->vStarts );
    Vec_WrdFree( p->vTruths2 );
    // attributes
    Vec_WecErase( &p->vFanouts );
    ABC_FREE( p->vLevels.pArray );
    ABC_FREE( p->vLevelsR.pArray );
    ABC_FREE( p->vCounts.pArray );
    ABC_FREE( p->vTravIds.pArray );
    ABC_FREE( p->vTravIds2.pArray );
    ABC_FREE( p->vId2Var.pArray );
    ABC_FREE( p->vVar2Id.pArray );
    Vec_WecFree( p->vCnfs );
    Vec_IntFree( p->vCover );
    // other data
    Vec_IntFreeP( &p->vNodes );
    Vec_IntFreeP( &p->vDivs  );
    Vec_IntFreeP( &p->vRoots );
    Vec_IntFreeP( &p->vTfo   );
    Vec_WrdFreeP( &p->vDivCexes );
    Vec_IntFreeP( &p->vOrder );
    Vec_IntFreeP( &p->vDivVars );
    Vec_IntFreeP( &p->vDivIds );
    Vec_IntFreeP( &p->vLits  );
    Vec_IntFreeP( &p->vValues );
    Vec_WecFreeP( &p->vClauses );
    Vec_IntFreeP( &p->vFaninMap );
    if ( p->pSat  ) sat_solver_delete( p->pSat );
    ABC_FREE( p );
}